

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

QRect __thiscall
QStyleSheetStyle::subControlRect
          (QStyleSheetStyle *this,ComplexControl cc,QStyleOptionComplex *opt,SubControl sc,
          QWidget *w)

{
  QLatin1StringView sh;
  QByteArrayView layout_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  bool bVar4;
  Int IVar5;
  Int IVar6;
  Int IVar7;
  int iVar8;
  QStyle *pQVar9;
  QStyleOptionComboBox *pQVar10;
  QStyleOptionSpinBox *pQVar11;
  QStyleOptionGroupBox *pQVar12;
  int *piVar13;
  QStyleSheetGeometryData *pQVar14;
  QStyleOptionToolButton *pQVar15;
  QStyleSheetPositionData *pQVar16;
  QStyleOptionSlider *pQVar17;
  QVariant *pQVar18;
  QStyleOptionTitleBar *pQVar19;
  LayoutDirection in_ECX;
  undefined1 auVar26 [12];
  QStyleOption *in_RDX;
  undefined8 uVar27;
  undefined4 in_ESI;
  QStyleSheetStyle *in_RDI;
  undefined8 in_R8;
  long in_FS_OFFSET;
  QRect QVar20;
  QLatin1StringView QVar21;
  QStyleOptionTitleBar *tb_1;
  SubControl control;
  int layoutButton;
  QVariant *val;
  add_const_t<QList<QVariant>_> *__range3;
  int width;
  int x;
  int sliderPos;
  int thickness;
  int len;
  bool horizontal;
  QStyleOptionSlider *slider;
  Origin origin_1;
  QStyleSheetPositionData *pos;
  int sliderstart;
  int slidermin;
  uint range;
  int sliderlen;
  int maxlen;
  Origin origin;
  PseudoElement pe;
  QStyleOptionSlider *sb;
  QStyleOptionToolButton *tb;
  int iw;
  int spacing;
  int tw;
  QStyleOptionGroupBox *gb;
  int widestR;
  int widestL;
  int downSize;
  int upSize;
  bool hasButtons;
  bool downRuleMatch;
  bool upRuleMatch;
  bool ruleMatch;
  QStyleOptionSpinBox *spin;
  QStyleOptionComboBox *cb;
  QHash<QStyle::SubControl,_QRect> layoutRects;
  const_iterator __end3;
  const_iterator __begin3;
  QList<QVariant> layout;
  QRect cr;
  QRect gr;
  QRect originRect;
  QRect sr;
  QRect contentRect;
  QRect grooveRect;
  QRect r_2;
  int ih;
  int th;
  Alignment downAlign;
  Alignment upAlign;
  QRect r2;
  QRect r;
  QStyleSheetStyleRecursionGuard recursion_guard;
  QRect r_1;
  QRenderRule subRule_6;
  QRenderRule subRule_5;
  QRenderRule subRule2;
  QRenderRule subRule_4;
  QRenderRule subRule_3;
  QRenderRule sliderRule;
  QStyleOptionSlider styleOptionSlider;
  QStyleOptionToolButton tool;
  QRenderRule subRule_2;
  QStyleOptionGroupBox groupBox_1;
  QRenderRule labelRule;
  QRenderRule indRule;
  QStyleOptionGroupBox groupBox;
  QStyleOptionSpinBox spinBox;
  QRenderRule downRule;
  QRenderRule upRule;
  QStyleOptionComboBox comboBox;
  QRenderRule subRule_1;
  QRenderRule subRule;
  QRenderRule rule;
  LayoutDirection in_stack_ffffffffffffefa8;
  undefined4 uVar22;
  Int IVar23;
  LayoutDirection LVar24;
  Origin in_stack_ffffffffffffefac;
  enum_type in_stack_ffffffffffffefb0;
  enum_type in_stack_ffffffffffffefb4;
  QFlagsStorage<Qt::AlignmentFlag> in_stack_ffffffffffffefb8;
  int in_stack_ffffffffffffefbc;
  QRenderRule *in_stack_ffffffffffffefc0;
  QFlagsStorage<Qt::AlignmentFlag> in_stack_ffffffffffffefc8;
  QFlagsStorage<Qt::AlignmentFlag> in_stack_ffffffffffffefcc;
  int in_stack_ffffffffffffefd0;
  undefined1 upsideDown;
  int in_stack_ffffffffffffefd4;
  int in_stack_ffffffffffffefd8;
  LayoutDirection in_stack_ffffffffffffefdc;
  int in_stack_ffffffffffffefe0;
  int in_stack_ffffffffffffefe4;
  PositionMode in_stack_ffffffffffffefe8;
  undefined4 in_stack_ffffffffffffefec;
  undefined4 in_stack_ffffffffffffeff0;
  undefined4 in_stack_ffffffffffffeff4;
  undefined4 in_stack_ffffffffffffeff8;
  undefined4 in_stack_ffffffffffffeffc;
  LayoutDirection in_stack_fffffffffffff014;
  undefined4 in_stack_fffffffffffff018;
  undefined4 in_stack_fffffffffffff01c;
  int in_stack_fffffffffffff024;
  undefined4 in_stack_fffffffffffff028;
  undefined4 in_stack_fffffffffffff02c;
  LayoutDirection in_stack_fffffffffffff030;
  undefined4 in_stack_fffffffffffff034;
  undefined4 in_stack_fffffffffffff038;
  undefined4 in_stack_fffffffffffff03c;
  QStyleOptionTitleBar *in_stack_fffffffffffff050;
  undefined4 in_stack_fffffffffffff058;
  undefined4 in_stack_fffffffffffff05c;
  undefined4 in_stack_fffffffffffff060;
  undefined4 in_stack_fffffffffffff064;
  int local_f98;
  int local_f94;
  int local_f90;
  int in_stack_fffffffffffff074;
  QObject *in_stack_fffffffffffff078;
  bool local_f7f;
  bool local_f7e;
  byte local_f7d;
  int in_stack_fffffffffffff0dc;
  int iVar25;
  undefined1 in_stack_fffffffffffff0e0 [16];
  undefined4 in_stack_fffffffffffff0f0;
  undefined4 in_stack_fffffffffffff0f4;
  int local_ecc;
  int local_eac;
  int local_e7c;
  QFlagsStorage<QStyle::SubControl> local_e2c;
  QVariant *local_e28;
  const_iterator local_e20;
  const_iterator local_e18 [6];
  undefined1 *local_de8;
  undefined1 *local_de0;
  undefined1 *local_dd8;
  QRect local_dbc;
  QSize local_dac;
  QSize local_da4;
  undefined1 local_d9c [16];
  QFlagsStorageHelper<Qt::Orientation,_4> local_d8c;
  undefined1 *local_d88;
  SubControl in_stack_fffffffffffff28c;
  undefined4 in_stack_fffffffffffff290;
  Representation in_stack_fffffffffffff294;
  Representation in_stack_fffffffffffff29c;
  Representation in_stack_fffffffffffff2a0;
  Representation in_stack_fffffffffffff2a4;
  undefined8 local_cdc;
  undefined8 local_cd4;
  QRect local_ccc;
  undefined8 local_cbc;
  undefined8 local_cb4;
  undefined8 local_cac;
  undefined8 local_ca4;
  undefined8 local_c9c;
  undefined8 local_c94;
  undefined8 local_c84;
  undefined8 local_c7c;
  QFlagsStorageHelper<QStyle::SubControl,_4> local_c5c;
  undefined1 local_c58 [16];
  Int local_c48;
  Int local_c44;
  QFlagsStorageHelper<QStyle::SubControl,_4> local_c40;
  int local_c3c;
  int local_c38;
  QRect local_c34;
  QRect local_c24;
  QRect local_c14;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_c04;
  int local_c00;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_bfc;
  int local_bf8;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_bf4;
  int local_bf0;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_bec;
  int local_be8;
  undefined1 local_be4 [16];
  undefined1 local_bd4 [16];
  Int local_bc4;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_bc0;
  Int local_bbc;
  Int local_bb8;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_bb4;
  Int local_bb0;
  Int local_bac;
  Int local_ba8;
  QRect local_ba4;
  QRect local_b94;
  QRect local_b84;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_b74;
  undefined1 local_b70 [16];
  undefined1 local_b60 [19];
  QStyleSheetStyleRecursionGuard local_b4d;
  LayoutDirection local_b4c;
  undefined1 local_b48 [16];
  undefined1 local_b38 [272];
  undefined1 local_a28 [136];
  undefined1 local_9a0 [136];
  undefined1 local_918 [136];
  undefined1 local_890 [136];
  undefined1 local_808 [136];
  undefined1 local_780 [16];
  undefined8 local_770;
  undefined8 local_768;
  int local_738;
  undefined1 local_700 [16];
  undefined8 local_6f0;
  undefined8 local_6e8;
  undefined1 local_668 [136];
  undefined1 local_5e0 [16];
  undefined8 local_5d0;
  undefined8 local_5c8;
  undefined1 local_558 [136];
  undefined1 local_4d0 [136];
  undefined1 local_448 [16];
  undefined8 local_438;
  undefined8 local_430;
  undefined1 local_3c0 [16];
  undefined8 local_3b0;
  undefined8 local_3a8;
  undefined1 local_368 [136];
  undefined1 local_2e0 [136];
  undefined1 local_258 [16];
  undefined8 local_248;
  undefined8 local_240;
  undefined1 local_1c8 [136];
  undefined1 local_140 [136];
  undefined1 *local_b8;
  undefined1 *puStack_b0;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_b4c = in_ECX;
  if ((globalStyleSheetStyle != (QStyleSheetStyle *)0x0) && (globalStyleSheetStyle != in_RDI)) {
    pQVar9 = baseStyle((QStyleSheetStyle *)
                       CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8.i));
    local_b48 = (**(code **)(*(long *)pQVar9 + 0xd8))(pQVar9,in_ESI,in_RDX,local_b4c,in_R8);
    goto LAB_00443288;
  }
  local_b4d.guarded = true;
  QStyleSheetStyleRecursionGuard::QStyleSheetStyleRecursionGuard(&local_b4d,in_RDI);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
  local_a8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
  local_b8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
  renderRule((QStyleSheetStyle *)CONCAT44(in_stack_fffffffffffff0f4,in_stack_fffffffffffff0f0),
             in_stack_fffffffffffff0e0._8_8_,in_stack_fffffffffffff0e0._0_8_,
             in_stack_fffffffffffff0dc);
  switch(in_ESI) {
  case 0:
    pQVar11 = qstyleoption_cast<QStyleOptionSpinBox_const*>(in_RDX);
    if (pQVar11 == (QStyleOptionSpinBox *)0x0) break;
    memset(local_2e0,0xaa,0x88);
    renderRule((QStyleSheetStyle *)CONCAT44(in_stack_fffffffffffff0f4,in_stack_fffffffffffff0f0),
               in_stack_fffffffffffff0e0._8_8_,in_stack_fffffffffffff0e0._0_8_,
               in_stack_fffffffffffff0dc);
    memset(local_368,0xaa,0x88);
    renderRule((QStyleSheetStyle *)CONCAT44(in_stack_fffffffffffff0f4,in_stack_fffffffffffff0f0),
               in_stack_fffffffffffff0e0._8_8_,in_stack_fffffffffffff0e0._0_8_,
               in_stack_fffffffffffff0dc);
    bVar4 = QRenderRule::hasBox((QRenderRule *)
                                CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0));
    local_f7d = 1;
    if (!bVar4) {
      bVar4 = QRenderRule::hasNativeBorder(in_stack_ffffffffffffefc0);
      local_f7d = bVar4 ^ 0xff;
    }
    bVar4 = QRenderRule::hasGeometry
                      ((QRenderRule *)CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0))
    ;
    local_f7e = true;
    if (!bVar4) {
      local_f7e = QRenderRule::hasPosition
                            ((QRenderRule *)
                             CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0));
    }
    bVar4 = QRenderRule::hasGeometry
                      ((QRenderRule *)CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0))
    ;
    local_f7f = true;
    if (!bVar4) {
      local_f7f = QRenderRule::hasPosition
                            ((QRenderRule *)
                             CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0));
    }
    if ((((local_f7d & 1) == 0) && (local_f7e == false)) && (local_f7f == false)) {
      memset(local_3c0,0xaa,0x58);
      QStyleOptionSpinBox::QStyleOptionSpinBox
                ((QStyleOptionSpinBox *)
                 CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0),
                 (QStyleOptionSpinBox *)
                 CONCAT44(in_stack_ffffffffffffefac,in_stack_ffffffffffffefa8));
      QVar20 = QRenderRule::borderRect
                         ((QRenderRule *)
                          CONCAT44(in_stack_ffffffffffffefcc.i,in_stack_ffffffffffffefc8.i),
                          (QRect *)in_stack_ffffffffffffefc0);
      local_c14._0_8_ = QVar20._0_8_;
      local_3b0._0_4_ = local_c14.x1.m_i;
      local_3b0._4_4_ = local_c14.y1.m_i;
      local_c14._8_8_ = QVar20._8_8_;
      local_3a8._0_4_ = local_c14.x2.m_i;
      local_3a8._4_4_ = local_c14.y2.m_i;
      local_c14 = QVar20;
      bVar4 = QRenderRule::baseStyleCanDraw
                        ((QRenderRule *)
                         CONCAT44(in_stack_ffffffffffffefac,in_stack_ffffffffffffefa8));
      if (bVar4) {
        pQVar9 = baseStyle((QStyleSheetStyle *)
                           CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8.i));
        local_b48 = (**(code **)(*(long *)pQVar9 + 0xd8))(pQVar9,in_ESI,local_3c0,local_b4c,in_R8);
      }
      else {
        local_b48 = (undefined1  [16])
                    QCommonStyle::subControlRect
                              ((QCommonStyle *)
                               CONCAT44(in_stack_fffffffffffff2a4.m_i,in_stack_fffffffffffff2a0.m_i)
                               ,in_stack_fffffffffffff29c.m_i,
                               (QStyleOptionComplex *)
                               CONCAT44(in_stack_fffffffffffff294.m_i,in_stack_fffffffffffff290),
                               in_stack_fffffffffffff28c,stack0xfffffffffffff280);
      }
      QStyleOptionSpinBox::~QStyleOptionSpinBox((QStyleOptionSpinBox *)0x441102);
    }
    else {
      switch(local_b4c) {
      case RightToLeft:
        if (local_f7e == false) goto LAB_00440f87;
        local_b48 = (undefined1  [16])
                    positionRect((QStyleSheetStyle *)
                                 CONCAT44(in_stack_ffffffffffffeffc,in_stack_ffffffffffffeff8),
                                 (QWidget *)
                                 CONCAT44(in_stack_ffffffffffffeff4,in_stack_ffffffffffffeff0),
                                 (QRenderRule *)
                                 CONCAT44(in_stack_ffffffffffffefec,in_stack_ffffffffffffefe8),
                                 (QRenderRule *)
                                 CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0),
                                 in_stack_ffffffffffffefdc,
                                 (QRect *)CONCAT44(in_stack_ffffffffffffefd4,
                                                   in_stack_ffffffffffffefd0),
                                 in_stack_fffffffffffff030);
        break;
      case LayoutDirectionAuto:
        if (local_f7f == false) goto LAB_00440f87;
        local_b48 = (undefined1  [16])
                    positionRect((QStyleSheetStyle *)
                                 CONCAT44(in_stack_ffffffffffffeffc,in_stack_ffffffffffffeff8),
                                 (QWidget *)
                                 CONCAT44(in_stack_ffffffffffffeff4,in_stack_ffffffffffffeff0),
                                 (QRenderRule *)
                                 CONCAT44(in_stack_ffffffffffffefec,in_stack_ffffffffffffefe8),
                                 (QRenderRule *)
                                 CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0),
                                 in_stack_ffffffffffffefdc,
                                 (QRect *)CONCAT44(in_stack_ffffffffffffefd4,
                                                   in_stack_ffffffffffffefd0),
                                 in_stack_fffffffffffff030);
        break;
      default:
LAB_00440f87:
        pQVar9 = baseStyle((QStyleSheetStyle *)
                           CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8.i));
        local_b48 = (**(code **)(*(long *)pQVar9 + 0xd8))(pQVar9,in_ESI,in_RDX,local_b4c,in_R8);
        break;
      case 4:
        local_b48 = (undefined1  [16])
                    QRenderRule::borderRect
                              ((QRenderRule *)
                               CONCAT44(in_stack_ffffffffffffefcc.i,in_stack_ffffffffffffefc8.i),
                               (QRect *)in_stack_ffffffffffffefc0);
        break;
      case 8:
        local_b48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_b48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_b48 = (undefined1  [16])
                    QRenderRule::contentsRect
                              ((QRenderRule *)
                               CONCAT44(in_stack_ffffffffffffefcc.i,in_stack_ffffffffffffefc8.i),
                               (QRect *)in_stack_ffffffffffffefc0);
        local_ba8 = 0xaaaaaaaa;
        QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x440aa1);
        local_bac = 0xaaaaaaaa;
        QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x440abb);
        bVar4 = QRenderRule::hasPosition
                          ((QRenderRule *)
                           CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0));
        if (bVar4) {
          pQVar16 = QRenderRule::position((QRenderRule *)0x440adb);
          local_bb0 = (pQVar16->position).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                      super_QFlagsStorage<Qt::AlignmentFlag>.i;
        }
        else {
          QFlags<Qt::AlignmentFlag>::QFlags
                    ((QFlags<Qt::AlignmentFlag> *)
                     CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0),
                     in_stack_ffffffffffffefac);
        }
        local_ba8 = local_bb0;
        local_bb8 = local_bb0;
        local_bb4.super_QFlagsStorage<Qt::AlignmentFlag>.i =
             (QFlagsStorage<Qt::AlignmentFlag>)
             resolveAlignment(in_stack_ffffffffffffefa8,(Alignment)in_stack_ffffffffffffefb8.i);
        local_ba8 = (Int)local_bb4.super_QFlagsStorage<Qt::AlignmentFlag>.i;
        bVar4 = QRenderRule::hasPosition
                          ((QRenderRule *)
                           CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0));
        if (bVar4) {
          pQVar16 = QRenderRule::position((QRenderRule *)0x440b61);
          local_bbc = (pQVar16->position).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                      super_QFlagsStorage<Qt::AlignmentFlag>.i;
        }
        else {
          QFlags<Qt::AlignmentFlag>::QFlags
                    ((QFlags<Qt::AlignmentFlag> *)
                     CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0),
                     in_stack_ffffffffffffefac);
        }
        local_bac = local_bbc;
        local_bc4 = local_bbc;
        local_bc0.super_QFlagsStorage<Qt::AlignmentFlag>.i =
             (QFlagsStorage<Qt::AlignmentFlag>)
             resolveAlignment(in_stack_ffffffffffffefa8,(Alignment)in_stack_ffffffffffffefb8.i);
        local_bac = (Int)local_bc0.super_QFlagsStorage<Qt::AlignmentFlag>.i;
        if (pQVar11->buttonSymbols == NoButtons) {
          iVar25 = 0;
          local_f90 = 0;
        }
        else {
          local_bd4 = (**(code **)(*(long *)&(in_RDI->super_QWindowsStyle).super_QCommonStyle.
                                             super_QStyle + 0xd8))(in_RDI,0,in_RDX,1,in_R8);
          iVar25 = QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffefac,
                                                  in_stack_ffffffffffffefa8));
          local_be4 = (**(code **)(*(long *)&(in_RDI->super_QWindowsStyle).super_QCommonStyle.
                                             super_QStyle + 0xd8))(in_RDI,0,in_RDX,2,in_R8);
          local_f90 = QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffefac,
                                                     in_stack_ffffffffffffefa8));
        }
        local_bec.super_QFlagsStorage<Qt::AlignmentFlag>.i =
             (QFlagsStorage<Qt::AlignmentFlag>)
             QFlags<Qt::AlignmentFlag>::operator&
                       ((QFlags<Qt::AlignmentFlag> *)
                        CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0),
                        in_stack_ffffffffffffefac);
        IVar5 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_bec);
        local_f94 = iVar25;
        if (IVar5 == 0) {
          local_f94 = 0;
        }
        local_be8 = local_f94;
        local_bf4.super_QFlagsStorage<Qt::AlignmentFlag>.i =
             (QFlagsStorage<Qt::AlignmentFlag>)
             QFlags<Qt::AlignmentFlag>::operator&
                       ((QFlags<Qt::AlignmentFlag> *)
                        CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0),
                        in_stack_ffffffffffffefac);
        IVar5 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_bf4);
        if (IVar5 == 0) {
          local_f98 = 0;
        }
        else {
          local_f98 = local_f90;
        }
        local_bf0 = local_f98;
        qMax<int>(&local_be8,&local_bf0);
        local_bfc.super_QFlagsStorage<Qt::AlignmentFlag>.i =
             (QFlagsStorage<Qt::AlignmentFlag>)
             QFlags<Qt::AlignmentFlag>::operator&
                       ((QFlags<Qt::AlignmentFlag> *)
                        CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0),
                        in_stack_ffffffffffffefac);
        IVar5 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_bfc);
        if (IVar5 == 0) {
          iVar25 = 0;
        }
        local_bf8 = iVar25;
        local_c04.super_QFlagsStorage<Qt::AlignmentFlag>.i =
             (QFlagsStorage<Qt::AlignmentFlag>)
             QFlags<Qt::AlignmentFlag>::operator&
                       ((QFlags<Qt::AlignmentFlag> *)
                        CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0),
                        in_stack_ffffffffffffefac);
        IVar5 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c04);
        if (IVar5 == 0) {
          local_f90 = 0;
        }
        local_c00 = local_f90;
        qMax<int>(&local_bf8,&local_c00);
        QRect::right((QRect *)0x440e5a);
        QRect::setRight((QRect *)CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0),
                        in_stack_ffffffffffffefac);
        QRect::left((QRect *)0x440e7d);
        QRect::setLeft((QRect *)CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0),
                       in_stack_ffffffffffffefac);
      }
    }
    QRenderRule::~QRenderRule
              ((QRenderRule *)CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0));
    QRenderRule::~QRenderRule
              ((QRenderRule *)CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0));
    auVar1 = local_be4;
    auVar2 = local_bd4;
    goto LAB_0044326e;
  case 1:
    pQVar10 = qstyleoption_cast<QStyleOptionComboBox_const*>(in_RDX);
    if (pQVar10 != (QStyleOptionComboBox *)0x0) {
      bVar4 = QRenderRule::hasBox((QRenderRule *)
                                  CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0));
      if ((bVar4) || (bVar4 = QRenderRule::hasNativeBorder(in_stack_ffffffffffffefc0), !bVar4)) {
        switch(local_b4c) {
        case RightToLeft:
          local_b48 = (undefined1  [16])
                      QRenderRule::borderRect
                                ((QRenderRule *)
                                 CONCAT44(in_stack_ffffffffffffefcc.i,in_stack_ffffffffffffefc8.i),
                                 (QRect *)in_stack_ffffffffffffefc0);
          auVar2._8_8_ = local_bd4._8_8_;
          auVar2._0_8_ = local_bd4._0_8_;
          auVar1._8_8_ = local_be4._8_8_;
          auVar1._0_8_ = local_be4._0_8_;
          break;
        case LayoutDirectionAuto:
          memset(local_140,0xaa,0x88);
          renderRule((QStyleSheetStyle *)
                     CONCAT44(in_stack_fffffffffffff0f4,in_stack_fffffffffffff0f0),
                     in_stack_fffffffffffff0e0._8_8_,in_stack_fffffffffffff0e0._0_8_,
                     in_stack_fffffffffffff0dc);
          local_b60._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_b60._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_b60._0_16_ =
               (undefined1  [16])
               QRenderRule::contentsRect
                         ((QRenderRule *)
                          CONCAT44(in_stack_ffffffffffffefcc.i,in_stack_ffffffffffffefc8.i),
                          (QRect *)in_stack_ffffffffffffefc0);
          local_b70._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_b70._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          LVar24 = in_RDX->direction;
          local_b70 = (undefined1  [16])
                      positionRect((QStyleSheetStyle *)
                                   CONCAT44(in_stack_ffffffffffffeffc,in_stack_ffffffffffffeff8),
                                   (QWidget *)
                                   CONCAT44(in_stack_ffffffffffffeff4,in_stack_ffffffffffffeff0),
                                   (QRenderRule *)
                                   CONCAT44(in_stack_ffffffffffffefec,in_stack_ffffffffffffefe8),
                                   (QRenderRule *)
                                   CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0),
                                   in_stack_ffffffffffffefdc,
                                   (QRect *)CONCAT44(in_stack_ffffffffffffefd4,
                                                     in_stack_ffffffffffffefd0),
                                   in_stack_fffffffffffff030);
          bVar3 = QRenderRule::hasPosition
                            ((QRenderRule *)
                             CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0));
          bVar4 = false;
          if (bVar3) {
            QRenderRule::position((QRenderRule *)0x4404b1);
            local_b74.super_QFlagsStorage<Qt::AlignmentFlag>.i =
                 (QFlagsStorage<Qt::AlignmentFlag>)
                 QFlags<Qt::AlignmentFlag>::operator&
                           ((QFlags<Qt::AlignmentFlag> *)
                            CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0),
                            in_stack_ffffffffffffefac);
            IVar5 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_b74);
            bVar4 = IVar5 != 0;
          }
          if (bVar4) {
            QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffefac,LVar24));
            local_b84 = QRect::adjusted((QRect *)CONCAT44(in_stack_ffffffffffffefec,
                                                          in_stack_ffffffffffffefe8),
                                        in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0,
                                        in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8);
            local_b48 = (undefined1  [16])
                        QStyle::visualRect(in_stack_ffffffffffffefdc,
                                           (QRect *)CONCAT44(in_stack_ffffffffffffefd4,
                                                             in_stack_ffffffffffffefd0),
                                           (QRect *)CONCAT44(in_stack_ffffffffffffefcc.i,
                                                             in_stack_ffffffffffffefc8.i));
          }
          else {
            QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffefac,LVar24));
            local_b94 = QRect::adjusted((QRect *)CONCAT44(in_stack_ffffffffffffefec,
                                                          in_stack_ffffffffffffefe8),
                                        in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0,
                                        in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8);
            local_b48 = (undefined1  [16])
                        QStyle::visualRect(in_stack_ffffffffffffefdc,
                                           (QRect *)CONCAT44(in_stack_ffffffffffffefd4,
                                                             in_stack_ffffffffffffefd0),
                                           (QRect *)CONCAT44(in_stack_ffffffffffffefcc.i,
                                                             in_stack_ffffffffffffefc8.i));
          }
          QRenderRule::~QRenderRule
                    ((QRenderRule *)CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0));
          auVar2._8_8_ = local_bd4._8_8_;
          auVar2._0_8_ = local_bd4._0_8_;
          auVar1._8_8_ = local_be4._8_8_;
          auVar1._0_8_ = local_be4._0_8_;
          break;
        case 4:
          memset(local_1c8,0xaa,0x88);
          renderRule((QStyleSheetStyle *)
                     CONCAT44(in_stack_fffffffffffff0f4,in_stack_fffffffffffff0f0),
                     in_stack_fffffffffffff0e0._8_8_,in_stack_fffffffffffff0e0._0_8_,
                     in_stack_fffffffffffff0dc);
          local_b48 = (undefined1  [16])
                      positionRect((QStyleSheetStyle *)
                                   CONCAT44(in_stack_ffffffffffffeffc,in_stack_ffffffffffffeff8),
                                   (QWidget *)
                                   CONCAT44(in_stack_ffffffffffffeff4,in_stack_ffffffffffffeff0),
                                   (QRenderRule *)
                                   CONCAT44(in_stack_ffffffffffffefec,in_stack_ffffffffffffefe8),
                                   (QRenderRule *)
                                   CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0),
                                   in_stack_ffffffffffffefdc,
                                   (QRect *)CONCAT44(in_stack_ffffffffffffefd4,
                                                     in_stack_ffffffffffffefd0),
                                   in_stack_fffffffffffff030);
          QRenderRule::~QRenderRule
                    ((QRenderRule *)CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0));
          auVar2._8_8_ = local_bd4._8_8_;
          auVar2._0_8_ = local_bd4._0_8_;
          auVar1._8_8_ = local_be4._8_8_;
          auVar1._0_8_ = local_be4._0_8_;
          break;
        case 8:
        default:
          pQVar9 = baseStyle((QStyleSheetStyle *)
                             CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8.i));
          local_b48 = (**(code **)(*(long *)pQVar9 + 0xd8))(pQVar9,in_ESI,in_RDX,local_b4c,in_R8);
          auVar2._8_8_ = local_bd4._8_8_;
          auVar2._0_8_ = local_bd4._0_8_;
          auVar1._8_8_ = local_be4._8_8_;
          auVar1._0_8_ = local_be4._0_8_;
        }
      }
      else {
        memset(local_258,0xaa,0x90);
        QStyleOptionComboBox::QStyleOptionComboBox
                  ((QStyleOptionComboBox *)
                   CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0),
                   (QStyleOptionComboBox *)
                   CONCAT44(in_stack_ffffffffffffefac,in_stack_ffffffffffffefa8));
        QVar20 = QRenderRule::borderRect
                           ((QRenderRule *)
                            CONCAT44(in_stack_ffffffffffffefcc.i,in_stack_ffffffffffffefc8.i),
                            (QRect *)in_stack_ffffffffffffefc0);
        local_ba4._0_8_ = QVar20._0_8_;
        local_248._0_4_ = local_ba4.x1.m_i;
        local_248._4_4_ = local_ba4.y1.m_i;
        local_ba4._8_8_ = QVar20._8_8_;
        local_240._0_4_ = local_ba4.x2.m_i;
        local_240._4_4_ = local_ba4.y2.m_i;
        local_ba4 = QVar20;
        bVar4 = QRenderRule::baseStyleCanDraw
                          ((QRenderRule *)
                           CONCAT44(in_stack_ffffffffffffefac,in_stack_ffffffffffffefa8));
        if (bVar4) {
          pQVar9 = baseStyle((QStyleSheetStyle *)
                             CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8.i));
          local_b48 = (**(code **)(*(long *)pQVar9 + 0xd8))(pQVar9,in_ESI,local_258,local_b4c,in_R8)
          ;
        }
        else {
          local_b48 = (undefined1  [16])
                      QCommonStyle::subControlRect
                                ((QCommonStyle *)
                                 CONCAT44(in_stack_fffffffffffff2a4.m_i,
                                          in_stack_fffffffffffff2a0.m_i),
                                 in_stack_fffffffffffff29c.m_i,
                                 (QStyleOptionComplex *)
                                 CONCAT44(in_stack_fffffffffffff294.m_i,in_stack_fffffffffffff290),
                                 in_stack_fffffffffffff28c,stack0xfffffffffffff280);
        }
        QStyleOptionComboBox::~QStyleOptionComboBox
                  ((QStyleOptionComboBox *)
                   CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0));
        auVar2._8_8_ = local_bd4._8_8_;
        auVar2._0_8_ = local_bd4._0_8_;
        auVar1._8_8_ = local_be4._8_8_;
        auVar1._0_8_ = local_be4._0_8_;
      }
      goto LAB_0044326e;
    }
    break;
  case 2:
    pQVar17 = qstyleoption_cast<QStyleOptionSlider_const*>(in_RDX);
    if (pQVar17 != (QStyleOptionSlider *)0x0) {
      memcpy(local_780,&DAT_00ab0438,0x80);
      QStyleOptionSlider::QStyleOptionSlider
                ((QStyleOptionSlider *)CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0)
                 ,(QStyleOptionSlider *)
                  CONCAT44(in_stack_ffffffffffffefac,in_stack_ffffffffffffefa8));
      QVar20 = QRenderRule::borderRect
                         ((QRenderRule *)
                          CONCAT44(in_stack_ffffffffffffefcc.i,in_stack_ffffffffffffefc8.i),
                          (QRect *)in_stack_ffffffffffffefc0);
      local_cac = QVar20._0_8_;
      local_770 = local_cac;
      local_ca4 = QVar20._8_8_;
      local_768 = local_ca4;
      bVar4 = QRenderRule::hasDrawable
                        ((QRenderRule *)
                         CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0));
      if ((bVar4) ||
         (bVar4 = QRenderRule::hasBox((QRenderRule *)
                                      CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0))
         , bVar4)) {
        QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0));
        bVar4 = QRenderRule::hasBox((QRenderRule *)
                                    CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0));
        if (bVar4) {
          QVar20 = QRenderRule::contentsRect
                             ((QRenderRule *)
                              CONCAT44(in_stack_ffffffffffffefcc.i,in_stack_ffffffffffffefc8.i),
                              (QRect *)in_stack_ffffffffffffefc0);
          local_cdc = QVar20._0_8_;
          local_cbc = local_cdc;
          local_cd4 = QVar20._8_8_;
          local_cb4 = local_cd4;
        }
        else {
          bVar4 = QRenderRule::baseStyleCanDraw
                            ((QRenderRule *)
                             CONCAT44(in_stack_ffffffffffffefac,in_stack_ffffffffffffefa8));
          if (bVar4) {
            pQVar9 = baseStyle((QStyleSheetStyle *)
                               CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8.i));
            local_ccc = (QRect)(**(code **)(*(long *)pQVar9 + 0xd8))
                                         (pQVar9,in_ESI,pQVar17,0x80,in_R8);
          }
          else {
            local_ccc = QCommonStyle::subControlRect
                                  ((QCommonStyle *)
                                   CONCAT44(in_stack_fffffffffffff2a4.m_i,
                                            in_stack_fffffffffffff2a0.m_i),
                                   in_stack_fffffffffffff29c.m_i,
                                   (QStyleOptionComplex *)
                                   CONCAT44(in_stack_fffffffffffff294.m_i,in_stack_fffffffffffff290)
                                   ,in_stack_fffffffffffff28c,stack0xfffffffffffff280);
          }
          QVar20 = local_ccc;
          local_cbc._0_4_ = local_ccc.x1.m_i;
          local_cbc._4_4_ = local_ccc.y1.m_i;
          local_ccc._8_8_ = QVar20._8_8_;
          local_cb4._0_4_ = local_ccc.x2.m_i;
          local_cb4._4_4_ = local_ccc.y2.m_i;
        }
        local_ecc = 0;
        if (local_b4c == RightToLeft) {
          local_ecc = 0x18;
LAB_004424ca:
          LVar24 = local_b4c;
          bVar4 = hasStyleRule((QStyleSheetStyle *)
                               CONCAT44(in_stack_ffffffffffffeff4,in_stack_ffffffffffffeff0),
                               in_stack_fffffffffffff078,in_stack_fffffffffffff074);
          if (bVar4) {
            memset(local_890,0xaa,0x88);
            renderRule((QStyleSheetStyle *)
                       CONCAT44(in_stack_fffffffffffff0f4,in_stack_fffffffffffff0f0),
                       in_stack_fffffffffffff0e0._8_8_,in_stack_fffffffffffff0e0._0_8_,
                       in_stack_fffffffffffff0dc);
            bVar4 = QRenderRule::hasPosition
                              ((QRenderRule *)
                               CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0));
            if (((bVar4) ||
                (bVar4 = QRenderRule::hasGeometry
                                   ((QRenderRule *)
                                    CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0)),
                bVar4)) ||
               (bVar4 = QRenderRule::hasBox((QRenderRule *)
                                            CONCAT44(in_stack_ffffffffffffefb4,
                                                     in_stack_ffffffffffffefb0)), bVar4)) {
              pQVar16 = QRenderRule::position((QRenderRule *)0x442578);
              in_stack_fffffffffffff2a4.m_i = (int)local_cbc;
              bVar4 = QRenderRule::hasBox((QRenderRule *)
                                          CONCAT44(in_stack_ffffffffffffefb4,
                                                   in_stack_ffffffffffffefb0));
              if (bVar4) {
                if ((pQVar16 == (QStyleSheetPositionData *)0x0) ||
                   (pQVar16->origin == Origin_Unknown)) {
                  defaultOrigin(local_ecc);
                }
                QVar20 = QRenderRule::originRect
                                   ((QRenderRule *)
                                    CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8),
                                    (QRect *)CONCAT44(in_stack_ffffffffffffefd4,
                                                      in_stack_ffffffffffffefd0),
                                    in_stack_ffffffffffffefcc.i);
                in_stack_fffffffffffff294 = QVar20.x1.m_i;
                in_stack_fffffffffffff29c = QVar20.x2.m_i;
                in_stack_fffffffffffff2a0 = QVar20.y2.m_i;
                in_stack_fffffffffffff2a4.m_i = in_stack_fffffffffffff294.m_i;
              }
              local_b48 = (undefined1  [16])
                          positionRect((QStyleSheetStyle *)
                                       CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038)
                                       ,(QWidget *)
                                        CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030
                                                ),
                                       (QRenderRule *)CONCAT44(LVar24,in_stack_fffffffffffff028),
                                       in_stack_fffffffffffff024,
                                       (QRect *)CONCAT44(in_stack_fffffffffffff01c,
                                                         in_stack_fffffffffffff018),
                                       in_stack_fffffffffffff014);
              bVar4 = true;
            }
            else {
              bVar4 = false;
            }
            QRenderRule::~QRenderRule
                      ((QRenderRule *)CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0))
            ;
            if (bVar4) goto LAB_00442789;
          }
          goto LAB_004426e7;
        }
        if (local_b4c == LayoutDirectionAuto) {
          local_ecc = 0x19;
          goto LAB_004424ca;
        }
        if ((local_b4c != 4) && (local_b4c != 8)) {
          if (local_b4c == 0x10) {
            local_ecc = 0x1a;
          }
          else if (local_b4c == 0x20) {
            local_ecc = 0x1b;
          }
          else {
            if (local_b4c == 0x40) goto LAB_00441f47;
            if (local_b4c == 0x80) {
              local_b48._8_8_ = local_cb4;
              local_b48._0_8_ = local_cbc;
              goto LAB_00442789;
            }
          }
          goto LAB_004424ca;
        }
LAB_00441f47:
        bVar4 = hasStyleRule((QStyleSheetStyle *)
                             CONCAT44(in_stack_ffffffffffffeff4,in_stack_ffffffffffffeff0),
                             in_stack_fffffffffffff078,in_stack_fffffffffffff074);
        if (bVar4) {
          memset(local_808,0xaa,0x88);
          renderRule((QStyleSheetStyle *)
                     CONCAT44(in_stack_fffffffffffff0f4,in_stack_fffffffffffff0f0),
                     in_stack_fffffffffffff0e0._8_8_,in_stack_fffffffffffff0e0._0_8_,
                     in_stack_fffffffffffff0dc);
          bVar4 = QRenderRule::hasPosition
                            ((QRenderRule *)
                             CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0));
          if (bVar4) {
            QRenderRule::position((QRenderRule *)0x44200a);
          }
          else {
            defaultOrigin(0x15);
          }
          QRenderRule::originRect
                    ((QRenderRule *)CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8),
                     (QRect *)CONCAT44(in_stack_ffffffffffffefd4,in_stack_ffffffffffffefd0),
                     in_stack_ffffffffffffefcc.i);
          QRenderRule::~QRenderRule
                    ((QRenderRule *)CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0));
        }
        if (local_738 == 1) {
          QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffefac,in_stack_ffffffffffffefa8));
        }
        else {
          QRect::height((QRect *)CONCAT44(in_stack_ffffffffffffefac,in_stack_ffffffffffffefa8));
        }
        if (pQVar17->maximum != pQVar17->minimum) {
          (**(code **)(*(long *)&(in_RDI->super_QWindowsStyle).super_QCommonStyle.super_QStyle +
                      0xe0))(in_RDI,10,pQVar17,in_R8);
        }
        if (local_738 == 1) {
          QRect::left((QRect *)0x4421e4);
        }
        else {
          QRect::top((QRect *)0x4421f7);
        }
        QStyle::sliderPositionFromValue
                  (in_stack_ffffffffffffefe0,in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8,
                   in_stack_ffffffffffffefd4,SUB41((uint)in_stack_ffffffffffffefd0 >> 0x18,0));
        if (pQVar17->orientation == Horizontal) {
          QRect::top((QRect *)0x44229b);
          QRect::height((QRect *)CONCAT44(in_stack_ffffffffffffefac,in_stack_ffffffffffffefa8));
          QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8.i),
                       in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0,in_stack_ffffffffffffefac
                       ,in_stack_ffffffffffffefa8);
        }
        else {
          QRect::left((QRect *)0x4422e2);
          QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffefac,in_stack_ffffffffffffefa8));
          QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8.i),
                       in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0,in_stack_ffffffffffffefac
                       ,in_stack_ffffffffffffefa8);
        }
        if (local_b4c == 8) {
          QRect::topLeft((QRect *)CONCAT44(in_stack_ffffffffffffefac,in_stack_ffffffffffffefa8));
          if (pQVar17->orientation == Horizontal) {
            QRect::bottomLeft((QRect *)CONCAT44(in_stack_ffffffffffffefac,in_stack_ffffffffffffefa8)
                             );
          }
          else {
            QRect::topRight((QRect *)CONCAT44(in_stack_ffffffffffffefac,in_stack_ffffffffffffefa8));
          }
          QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffefd4,in_stack_ffffffffffffefd0),
                       (QPoint *)CONCAT44(in_stack_ffffffffffffefcc.i,in_stack_ffffffffffffefc8.i),
                       (QPoint *)in_stack_ffffffffffffefc0);
        }
        else if (local_b4c == 4) {
          if (pQVar17->orientation == Horizontal) {
            QRect::topRight((QRect *)CONCAT44(in_stack_ffffffffffffefac,in_stack_ffffffffffffefa8));
          }
          else {
            QRect::bottomLeft((QRect *)CONCAT44(in_stack_ffffffffffffefac,in_stack_ffffffffffffefa8)
                             );
          }
          QRect::bottomRight((QRect *)CONCAT44(in_stack_ffffffffffffefac,in_stack_ffffffffffffefa8))
          ;
          QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffefd4,in_stack_ffffffffffffefd0),
                       (QPoint *)CONCAT44(in_stack_ffffffffffffefcc.i,in_stack_ffffffffffffefc8.i),
                       (QPoint *)in_stack_ffffffffffffefc0);
        }
        local_b48 = (undefined1  [16])
                    QStyle::visualRect(in_stack_ffffffffffffefdc,
                                       (QRect *)CONCAT44(in_stack_ffffffffffffefd4,
                                                         in_stack_ffffffffffffefd0),
                                       (QRect *)CONCAT44(in_stack_ffffffffffffefcc.i,
                                                         in_stack_ffffffffffffefc8.i));
      }
      else {
LAB_004426e7:
        bVar4 = QRenderRule::baseStyleCanDraw
                          ((QRenderRule *)
                           CONCAT44(in_stack_ffffffffffffefac,in_stack_ffffffffffffefa8));
        if (bVar4) {
          pQVar9 = baseStyle((QStyleSheetStyle *)
                             CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8.i));
          local_b48 = (**(code **)(*(long *)pQVar9 + 0xd8))(pQVar9,in_ESI,local_780,local_b4c,in_R8)
          ;
        }
        else {
          local_b48 = (undefined1  [16])
                      QCommonStyle::subControlRect
                                ((QCommonStyle *)
                                 CONCAT44(in_stack_fffffffffffff2a4.m_i,
                                          in_stack_fffffffffffff2a0.m_i),
                                 in_stack_fffffffffffff29c.m_i,
                                 (QStyleOptionComplex *)
                                 CONCAT44(in_stack_fffffffffffff294.m_i,in_stack_fffffffffffff290),
                                 in_stack_fffffffffffff28c,stack0xfffffffffffff280);
        }
      }
LAB_00442789:
      QStyleOptionSlider::~QStyleOptionSlider((QStyleOptionSlider *)0x442796);
      auVar2._8_8_ = local_bd4._8_8_;
      auVar2._0_8_ = local_bd4._0_8_;
      auVar1._8_8_ = local_be4._8_8_;
      auVar1._0_8_ = local_be4._0_8_;
      goto LAB_0044326e;
    }
    break;
  case 3:
    pQVar17 = qstyleoption_cast<QStyleOptionSlider_const*>(in_RDX);
    if (pQVar17 != (QStyleOptionSlider *)0x0) {
      memset(local_918,0xaa,0x88);
      renderRule((QStyleSheetStyle *)CONCAT44(in_stack_fffffffffffff0f4,in_stack_fffffffffffff0f0),
                 in_stack_fffffffffffff0e0._8_8_,in_stack_fffffffffffff0e0._0_8_,
                 in_stack_fffffffffffff0dc);
      bVar4 = QRenderRule::hasDrawable
                        ((QRenderRule *)
                         CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0));
      if (bVar4) {
        QSharedDataPointer<QStyleSheetImageData>::operator=
                  ((QSharedDataPointer<QStyleSheetImageData> *)
                   CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0),
                   (QStyleSheetImageData *)
                   CONCAT44(in_stack_ffffffffffffefac,in_stack_ffffffffffffefa8));
        stack0xfffffffffffff280 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
        local_d88 = &DAT_aaaaaaaaaaaaaaaa;
        LVar24 = in_RDX->direction;
        _local_d88 = positionRect((QStyleSheetStyle *)
                                  CONCAT44(in_stack_ffffffffffffeffc,in_stack_ffffffffffffeff8),
                                  (QWidget *)
                                  CONCAT44(in_stack_ffffffffffffeff4,in_stack_ffffffffffffeff0),
                                  (QRenderRule *)
                                  CONCAT44(in_stack_ffffffffffffefec,in_stack_ffffffffffffefe8),
                                  (QRenderRule *)
                                  CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0),
                                  in_stack_ffffffffffffefdc,
                                  (QRect *)CONCAT44(in_stack_ffffffffffffefd4,
                                                    in_stack_ffffffffffffefd0),
                                  in_stack_fffffffffffff030);
        upsideDown = (undefined1)((uint)in_stack_ffffffffffffefd0 >> 0x18);
        if (local_b4c == RightToLeft) {
          local_e7c = 1;
          local_b48 = (undefined1  [16])_local_d88;
        }
        else if (local_b4c == LayoutDirectionAuto) {
          local_d8c.super_QFlagsStorage<Qt::Orientation>.i =
               (QFlagsStorage<Qt::Orientation>)
               Qt::operator&(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0);
          IVar7 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_d8c);
          bVar4 = IVar7 == 0;
          local_d9c._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_d9c._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_d9c = (undefined1  [16])
                      QRenderRule::contentsRect
                                ((QRenderRule *)
                                 CONCAT44(in_stack_ffffffffffffefcc.i,in_stack_ffffffffffffefc8.i),
                                 (QRect *)in_stack_ffffffffffffefc0);
          memset(local_9a0,0xaa,0x88);
          renderRule((QStyleSheetStyle *)
                     CONCAT44(in_stack_fffffffffffff0f4,in_stack_fffffffffffff0f0),
                     in_stack_fffffffffffff0e0._8_8_,in_stack_fffffffffffff0e0._0_8_,
                     in_stack_fffffffffffff0dc);
          if (bVar4) {
            local_dac = QRenderRule::size((QRenderRule *)
                                          CONCAT44(in_stack_ffffffffffffefbc,
                                                   in_stack_ffffffffffffefb8.i));
            QSize::height((QSize *)0x442a09);
          }
          else {
            local_da4 = QRenderRule::size((QRenderRule *)
                                          CONCAT44(in_stack_ffffffffffffefbc,
                                                   in_stack_ffffffffffffefb8.i));
            QSize::width((QSize *)0x4429e1);
          }
          QSharedDataPointer<QStyleSheetImageData>::operator=
                    ((QSharedDataPointer<QStyleSheetImageData> *)
                     CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0),
                     (QStyleSheetImageData *)CONCAT44(in_stack_ffffffffffffefac,LVar24));
          QSharedDataPointer<QStyleSheetGeometryData>::operator=
                    ((QSharedDataPointer<QStyleSheetGeometryData> *)
                     CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0),
                     (QStyleSheetGeometryData *)CONCAT44(in_stack_ffffffffffffefac,LVar24));
          local_dbc = positionRect((QStyleSheetStyle *)
                                   CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038),
                                   (QWidget *)
                                   CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
                                   (QRenderRule *)
                                   CONCAT44(in_stack_fffffffffffff02c,in_stack_fffffffffffff028),
                                   in_stack_fffffffffffff024,
                                   (QRect *)CONCAT44(in_stack_fffffffffffff01c,
                                                     in_stack_fffffffffffff018),
                                   in_stack_fffffffffffff014);
          local_d9c = (undefined1  [16])local_dbc;
          if (bVar4) {
            QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffefac,LVar24));
            QRect::height((QRect *)CONCAT44(in_stack_ffffffffffffefac,LVar24));
          }
          else {
            QRect::height((QRect *)CONCAT44(in_stack_ffffffffffffefac,LVar24));
            QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffefac,LVar24));
          }
          QStyle::sliderPositionFromValue
                    (in_stack_ffffffffffffefe0,in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8,
                     in_stack_ffffffffffffefd4,(bool)upsideDown);
          if (bVar4) {
            QRect::x((QRect *)0x442bd0);
            QRect::y((QRect *)0x442be1);
            QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8.i),
                         in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0,
                         in_stack_ffffffffffffefac,LVar24);
          }
          else {
            QRect::x((QRect *)0x442b87);
            QRect::y((QRect *)0x442b9f);
            QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8.i),
                         in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0,
                         in_stack_ffffffffffffefac,LVar24);
          }
          local_b48 = (undefined1  [16])
                      QRenderRule::borderRect
                                ((QRenderRule *)
                                 CONCAT44(in_stack_ffffffffffffefcc.i,in_stack_ffffffffffffefc8.i),
                                 (QRect *)in_stack_ffffffffffffefc0);
          local_e7c = 1;
          QRenderRule::~QRenderRule
                    ((QRenderRule *)CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0));
        }
        else {
          local_e7c = 0;
        }
      }
      else {
        local_e7c = 2;
      }
      QRenderRule::~QRenderRule
                ((QRenderRule *)CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0));
      auVar2._8_8_ = local_bd4._8_8_;
      auVar2._0_8_ = local_bd4._0_8_;
      auVar1._8_8_ = local_be4._8_8_;
      auVar1._0_8_ = local_be4._0_8_;
      if (local_e7c != 0) goto joined_r0x00443214;
    }
    break;
  case 4:
    pQVar15 = qstyleoption_cast<QStyleOptionToolButton_const*>(in_RDX);
    if (pQVar15 != (QStyleOptionToolButton *)0x0) {
      bVar4 = QRenderRule::hasBox((QRenderRule *)
                                  CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0));
      if ((bVar4) || (bVar4 = QRenderRule::hasNativeBorder(in_stack_ffffffffffffefc0), !bVar4)) {
        if (local_b4c == RightToLeft) {
          local_b48 = (undefined1  [16])
                      QRenderRule::borderRect
                                ((QRenderRule *)
                                 CONCAT44(in_stack_ffffffffffffefcc.i,in_stack_ffffffffffffefc8.i),
                                 (QRect *)in_stack_ffffffffffffefc0);
          auVar2._8_8_ = local_bd4._8_8_;
          auVar2._0_8_ = local_bd4._0_8_;
          auVar1._8_8_ = local_be4._8_8_;
          auVar1._0_8_ = local_be4._0_8_;
        }
        else {
          if (local_b4c != LayoutDirectionAuto) goto LAB_00441b4d;
          memset(local_668,0xaa,0x88);
          renderRule((QStyleSheetStyle *)
                     CONCAT44(in_stack_fffffffffffff0f4,in_stack_fffffffffffff0f0),
                     in_stack_fffffffffffff0e0._8_8_,in_stack_fffffffffffff0e0._0_8_,
                     in_stack_fffffffffffff0dc);
          local_b48 = (undefined1  [16])
                      positionRect((QStyleSheetStyle *)
                                   CONCAT44(in_stack_ffffffffffffeffc,in_stack_ffffffffffffeff8),
                                   (QWidget *)
                                   CONCAT44(in_stack_ffffffffffffeff4,in_stack_ffffffffffffeff0),
                                   (QRenderRule *)
                                   CONCAT44(in_stack_ffffffffffffefec,in_stack_ffffffffffffefe8),
                                   (QRenderRule *)
                                   CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0),
                                   in_stack_ffffffffffffefdc,
                                   (QRect *)CONCAT44(in_stack_ffffffffffffefd4,
                                                     in_stack_ffffffffffffefd0),local_b4c);
          QRenderRule::~QRenderRule
                    ((QRenderRule *)CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0));
          auVar2._8_8_ = local_bd4._8_8_;
          auVar2._0_8_ = local_bd4._0_8_;
          auVar1._8_8_ = local_be4._8_8_;
          auVar1._0_8_ = local_be4._0_8_;
        }
      }
      else {
LAB_00441b4d:
        memset(local_700,0xaa,0x98);
        QStyleOptionToolButton::QStyleOptionToolButton
                  ((QStyleOptionToolButton *)
                   CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0),
                   (QStyleOptionToolButton *)
                   CONCAT44(in_stack_ffffffffffffefac,in_stack_ffffffffffffefa8));
        QVar20 = QRenderRule::borderRect
                           ((QRenderRule *)
                            CONCAT44(in_stack_ffffffffffffefcc.i,in_stack_ffffffffffffefc8.i),
                            (QRect *)in_stack_ffffffffffffefc0);
        local_c9c = QVar20._0_8_;
        local_6f0 = local_c9c;
        local_c94 = QVar20._8_8_;
        local_6e8 = local_c94;
        bVar4 = QRenderRule::baseStyleCanDraw
                          ((QRenderRule *)
                           CONCAT44(in_stack_ffffffffffffefac,in_stack_ffffffffffffefa8));
        if (bVar4) {
          pQVar9 = baseStyle((QStyleSheetStyle *)
                             CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8.i));
          local_b48 = (**(code **)(*(long *)pQVar9 + 0xd8))(pQVar9,in_ESI,local_700,local_b4c,in_R8)
          ;
        }
        else {
          local_b48 = (undefined1  [16])
                      QCommonStyle::subControlRect
                                ((QCommonStyle *)
                                 CONCAT44(in_stack_fffffffffffff2a4.m_i,
                                          in_stack_fffffffffffff2a0.m_i),
                                 in_stack_fffffffffffff29c.m_i,
                                 (QStyleOptionComplex *)
                                 CONCAT44(in_stack_fffffffffffff294.m_i,in_stack_fffffffffffff290),
                                 in_stack_fffffffffffff28c,stack0xfffffffffffff280);
        }
        QStyleOptionToolButton::~QStyleOptionToolButton
                  ((QStyleOptionToolButton *)
                   CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0));
        auVar2._8_8_ = local_bd4._8_8_;
        auVar2._0_8_ = local_bd4._0_8_;
        auVar1._8_8_ = local_be4._8_8_;
        auVar1._0_8_ = local_be4._0_8_;
      }
      goto LAB_0044326e;
    }
    break;
  case 5:
    pQVar19 = qstyleoption_cast<QStyleOptionTitleBar_const*>(in_RDX);
    if (pQVar19 != (QStyleOptionTitleBar *)0x0) {
      memset(local_b38,0xaa,0x88);
      renderRule((QStyleSheetStyle *)CONCAT44(in_stack_fffffffffffff0f4,in_stack_fffffffffffff0f0),
                 in_stack_fffffffffffff0e0._8_8_,in_stack_fffffffffffff0e0._0_8_,
                 in_stack_fffffffffffff0dc);
      bVar4 = QRenderRule::hasDrawable
                        ((QRenderRule *)
                         CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0));
      if (((bVar4) ||
          (bVar4 = QRenderRule::hasBox((QRenderRule *)
                                       CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0)
                                      ), bVar4)) ||
         (bVar4 = QRenderRule::hasBorder
                            ((QRenderRule *)
                             CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0)), bVar4))
      {
        titleBarLayout((QStyleSheetStyle *)
                       CONCAT44(in_stack_fffffffffffff064,in_stack_fffffffffffff060),
                       (QWidget *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058),
                       in_stack_fffffffffffff050);
        local_b48 = (undefined1  [16])
                    QHash<QStyle::SubControl,_QRect>::value
                              ((QHash<QStyle::SubControl,_QRect> *)
                               CONCAT44(in_stack_ffffffffffffefcc.i,in_stack_ffffffffffffefc8.i),
                               (SubControl *)in_stack_ffffffffffffefc0);
        local_e7c = 1;
        QHash<QStyle::SubControl,_QRect>::~QHash
                  ((QHash<QStyle::SubControl,_QRect> *)
                   CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0));
      }
      else {
        local_e7c = 2;
      }
      QRenderRule::~QRenderRule
                ((QRenderRule *)CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0));
      auVar2._8_8_ = local_bd4._8_8_;
      auVar2._0_8_ = local_bd4._0_8_;
      auVar1._8_8_ = local_be4._8_8_;
      auVar1._0_8_ = local_be4._0_8_;
joined_r0x00443214:
      if (local_e7c != 2) goto LAB_0044326e;
    }
    break;
  default:
    break;
  case 7:
    pQVar12 = qstyleoption_cast<QStyleOptionGroupBox_const*>(in_RDX);
    if (pQVar12 != (QStyleOptionGroupBox *)0x0) {
      if ((local_b4c - RightToLeft < 2) || ((local_b4c != 4 && (local_b4c != 8)))) {
        memset(local_4d0,0xaa,0x88);
        renderRule((QStyleSheetStyle *)CONCAT44(in_stack_fffffffffffff0f4,in_stack_fffffffffffff0f0)
                   ,in_stack_fffffffffffff0e0._8_8_,in_stack_fffffffffffff0e0._0_8_,
                   in_stack_fffffffffffff0dc);
        memset(local_558,0xaa,0x88);
        renderRule((QStyleSheetStyle *)CONCAT44(in_stack_fffffffffffff0f4,in_stack_fffffffffffff0f0)
                   ,in_stack_fffffffffffff0e0._8_8_,in_stack_fffffffffffff0e0._0_8_,
                   in_stack_fffffffffffff0dc);
        bVar4 = QRenderRule::hasPosition
                          ((QRenderRule *)
                           CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0));
        if ((bVar4) ||
           ((((bVar4 = QRenderRule::hasGeometry
                                 ((QRenderRule *)
                                  CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0)),
              bVar4 || (bVar4 = QRenderRule::hasBox((QRenderRule *)
                                                    CONCAT44(in_stack_ffffffffffffefb4,
                                                             in_stack_ffffffffffffefb0)), bVar4)) ||
             (bVar4 = QRenderRule::hasBorder
                                ((QRenderRule *)
                                 CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0)),
             bVar4)) ||
            (bVar4 = QRenderRule::hasContentsSize
                               ((QRenderRule *)
                                CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0)),
            bVar4)))) {
          local_eac = QFontMetrics::horizontalAdvance
                                ((QString *)&in_RDX->fontMetrics,(int)pQVar12 + 0x50);
          local_c38 = QFontMetrics::height();
          iVar25 = (**(code **)(*(long *)&(in_RDI->super_QWindowsStyle).super_QCommonStyle.
                                          super_QStyle + 0xe0))(in_RDI,0x43,in_RDX,in_R8);
          iVar8 = (**(code **)(*(long *)&(in_RDI->super_QWindowsStyle).super_QCommonStyle.
                                         super_QStyle + 0xe0))(in_RDI,0x25,in_RDX,in_R8);
          local_c3c = (**(code **)(*(long *)&(in_RDI->super_QWindowsStyle).super_QCommonStyle.
                                             super_QStyle + 0xe0))(in_RDI,0x26,in_RDX,in_R8);
          local_c40.super_QFlagsStorage<QStyle::SubControl>.i =
               (QFlagsStorage<QStyle::SubControl>)
               QFlags<QStyle::SubControl>::operator&
                         ((QFlags<QStyle::SubControl> *)
                          CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0),
                          in_stack_ffffffffffffefac);
          IVar6 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c40);
          if (IVar6 != 0) {
            local_eac = local_eac + iVar8 + iVar25;
            piVar13 = qMax<int>(&local_c38,&local_c3c);
            local_c38 = *piVar13;
          }
          bVar4 = QRenderRule::hasGeometry
                            ((QRenderRule *)
                             CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0));
          if (bVar4) {
            pQVar14 = QSharedDataPointer<QStyleSheetGeometryData>::operator->
                                ((QSharedDataPointer<QStyleSheetGeometryData> *)
                                 CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0));
            iVar25 = local_c38;
            pQVar14->width = local_eac;
            pQVar14 = QSharedDataPointer<QStyleSheetGeometryData>::operator->
                                ((QSharedDataPointer<QStyleSheetGeometryData> *)
                                 CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0));
            pQVar14->height = iVar25;
          }
          else {
            operator_new(0x1c);
            uVar22 = 0xffffffff;
            QStyleSheetGeometryData::QStyleSheetGeometryData
                      ((QStyleSheetGeometryData *)in_stack_ffffffffffffefc0,
                       in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8.i,
                       in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0,in_stack_ffffffffffffefac
                       ,in_stack_ffffffffffffefd0);
            QSharedDataPointer<QStyleSheetGeometryData>::operator=
                      ((QSharedDataPointer<QStyleSheetGeometryData> *)
                       CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0),
                       (QStyleSheetGeometryData *)CONCAT44(in_stack_ffffffffffffefac,uVar22));
          }
          bVar4 = QRenderRule::hasPosition
                            ((QRenderRule *)
                             CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0));
          if (!bVar4) {
            operator_new(0x24);
            defaultOrigin(0xf);
            local_c44 = (pQVar12->textAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                        super_QFlagsStorage<Qt::AlignmentFlag>.i;
            memset(&local_c48,0,4);
            QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x441714);
            in_stack_ffffffffffffefb0 = Horizontal;
            IVar23 = local_c44;
            QStyleSheetPositionData::QStyleSheetPositionData
                      ((QStyleSheetPositionData *)in_stack_ffffffffffffefc0,
                       in_stack_ffffffffffffefbc,local_c48,in_stack_ffffffffffffefb4,1,
                       in_stack_ffffffffffffefac,(Alignment)in_stack_ffffffffffffefcc.i,
                       in_stack_ffffffffffffefe8,(Alignment)in_stack_ffffffffffffefc8.i);
            QSharedDataPointer<QStyleSheetPositionData>::operator=
                      ((QSharedDataPointer<QStyleSheetPositionData> *)
                       CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0),
                       (QStyleSheetPositionData *)CONCAT44(in_stack_ffffffffffffefac,IVar23));
            in_stack_ffffffffffffefb8.i = local_c48;
          }
          local_c58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_c58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          LVar24 = in_RDX->direction;
          local_c58 = (undefined1  [16])
                      positionRect((QStyleSheetStyle *)
                                   CONCAT44(in_stack_ffffffffffffeffc,in_stack_ffffffffffffeff8),
                                   (QWidget *)
                                   CONCAT44(in_stack_ffffffffffffeff4,in_stack_ffffffffffffeff0),
                                   (QRenderRule *)
                                   CONCAT44(in_stack_ffffffffffffefec,in_stack_ffffffffffffefe8),
                                   (QRenderRule *)
                                   CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0),
                                   in_stack_ffffffffffffefdc,
                                   (QRect *)CONCAT44(in_stack_ffffffffffffefd4,
                                                     in_stack_ffffffffffffefd0),
                                   in_stack_fffffffffffff030);
          local_c5c.super_QFlagsStorage<QStyle::SubControl>.i =
               (QFlagsStorage<QStyle::SubControl>)
               QFlags<QStyle::SubControl>::operator&
                         ((QFlags<QStyle::SubControl> *)
                          CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0),
                          in_stack_ffffffffffffefac);
          IVar6 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c5c);
          if (IVar6 == 0) {
            local_b48 = (undefined1  [16])
                        QRenderRule::contentsRect
                                  ((QRenderRule *)
                                   CONCAT44(in_stack_ffffffffffffefcc.i,in_stack_ffffffffffffefc8.i)
                                   ,(QRect *)in_stack_ffffffffffffefc0);
          }
          else {
            local_c58 = (undefined1  [16])
                        QRenderRule::contentsRect
                                  ((QRenderRule *)
                                   CONCAT44(in_stack_ffffffffffffefcc.i,in_stack_ffffffffffffefc8.i)
                                   ,(QRect *)in_stack_ffffffffffffefc0);
            if (local_b4c == LayoutDirectionAuto) {
              QRect::left((QRect *)0x44186f);
              QRect::setLeft((QRect *)CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0),
                             in_stack_ffffffffffffefac);
              QRect::center((QRect *)CONCAT44(in_stack_ffffffffffffefd4,in_stack_ffffffffffffefd0));
              QPoint::y((QPoint *)0x4418ae);
              QRect::setTop((QRect *)CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0),
                            in_stack_ffffffffffffefac);
            }
            else {
              QRect::left((QRect *)0x4418e0);
              QRect::center((QRect *)CONCAT44(in_stack_ffffffffffffefd4,in_stack_ffffffffffffefd0));
              QPoint::y((QPoint *)0x441909);
              QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8.i),
                           in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0,
                           in_stack_ffffffffffffefac,LVar24);
              local_c58._8_8_ = local_c7c;
              local_c58._0_8_ = local_c84;
            }
            local_b48 = local_c58;
          }
        }
        else {
          memset(local_5e0,0xaa,0x88);
          QStyleOptionGroupBox::QStyleOptionGroupBox
                    ((QStyleOptionGroupBox *)
                     CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0),
                     (QStyleOptionGroupBox *)
                     CONCAT44(in_stack_ffffffffffffefac,in_stack_ffffffffffffefa8));
          QVar20 = QRenderRule::borderRect
                             ((QRenderRule *)
                              CONCAT44(in_stack_ffffffffffffefcc.i,in_stack_ffffffffffffefc8.i),
                              (QRect *)in_stack_ffffffffffffefc0);
          local_c34._0_8_ = QVar20._0_8_;
          local_5d0._0_4_ = local_c34.x1.m_i;
          local_5d0._4_4_ = local_c34.y1.m_i;
          local_c34._8_8_ = QVar20._8_8_;
          local_5c8._0_4_ = local_c34.x2.m_i;
          local_5c8._4_4_ = local_c34.y2.m_i;
          local_c34 = QVar20;
          pQVar9 = baseStyle((QStyleSheetStyle *)
                             CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8.i));
          local_b48 = (**(code **)(*(long *)pQVar9 + 0xd8))(pQVar9,in_ESI,local_5e0,local_b4c,in_R8)
          ;
          QStyleOptionGroupBox::~QStyleOptionGroupBox
                    ((QStyleOptionGroupBox *)
                     CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0));
        }
        QRenderRule::~QRenderRule
                  ((QRenderRule *)CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0));
        QRenderRule::~QRenderRule
                  ((QRenderRule *)CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0));
        auVar2._8_8_ = local_bd4._8_8_;
        auVar2._0_8_ = local_bd4._0_8_;
        auVar1._8_8_ = local_be4._8_8_;
        auVar1._0_8_ = local_be4._0_8_;
      }
      else {
        bVar4 = QRenderRule::hasBox((QRenderRule *)
                                    CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0));
        if ((bVar4) || (bVar4 = QRenderRule::hasNativeBorder(in_stack_ffffffffffffefc0), !bVar4)) {
          if (local_b4c == 8) {
            local_b48 = (undefined1  [16])
                        QRenderRule::borderRect
                                  ((QRenderRule *)
                                   CONCAT44(in_stack_ffffffffffffefcc.i,in_stack_ffffffffffffefc8.i)
                                   ,(QRect *)in_stack_ffffffffffffefc0);
            auVar2._8_8_ = local_bd4._8_8_;
            auVar2._0_8_ = local_bd4._0_8_;
            auVar1._8_8_ = local_be4._8_8_;
            auVar1._0_8_ = local_be4._0_8_;
          }
          else {
            local_b48 = (undefined1  [16])
                        QRenderRule::contentsRect
                                  ((QRenderRule *)
                                   CONCAT44(in_stack_ffffffffffffefcc.i,in_stack_ffffffffffffefc8.i)
                                   ,(QRect *)in_stack_ffffffffffffefc0);
            auVar2._8_8_ = local_bd4._8_8_;
            auVar2._0_8_ = local_bd4._0_8_;
            auVar1._8_8_ = local_be4._8_8_;
            auVar1._0_8_ = local_be4._0_8_;
          }
        }
        else {
          memset(local_448,0xaa,0x88);
          QStyleOptionGroupBox::QStyleOptionGroupBox
                    ((QStyleOptionGroupBox *)
                     CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0),
                     (QStyleOptionGroupBox *)
                     CONCAT44(in_stack_ffffffffffffefac,in_stack_ffffffffffffefa8));
          QVar20 = QRenderRule::borderRect
                             ((QRenderRule *)
                              CONCAT44(in_stack_ffffffffffffefcc.i,in_stack_ffffffffffffefc8.i),
                              (QRect *)in_stack_ffffffffffffefc0);
          local_c24._0_8_ = QVar20._0_8_;
          local_438._0_4_ = local_c24.x1.m_i;
          local_438._4_4_ = local_c24.y1.m_i;
          local_c24._8_8_ = QVar20._8_8_;
          local_430._0_4_ = local_c24.x2.m_i;
          local_430._4_4_ = local_c24.y2.m_i;
          local_c24 = QVar20;
          pQVar9 = baseStyle((QStyleSheetStyle *)
                             CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8.i));
          local_b48 = (**(code **)(*(long *)pQVar9 + 0xd8))(pQVar9,in_ESI,local_448,local_b4c,in_R8)
          ;
          QStyleOptionGroupBox::~QStyleOptionGroupBox
                    ((QStyleOptionGroupBox *)
                     CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0));
          auVar2._8_8_ = local_bd4._8_8_;
          auVar2._0_8_ = local_bd4._0_8_;
          auVar1._8_8_ = local_be4._8_8_;
          auVar1._0_8_ = local_be4._0_8_;
        }
      }
      goto LAB_0044326e;
    }
    break;
  case 8:
    bVar4 = hasStyleRule((QStyleSheetStyle *)
                         CONCAT44(in_stack_ffffffffffffeff4,in_stack_ffffffffffffeff0),
                         in_stack_fffffffffffff078,in_stack_fffffffffffff074);
    if (((bVar4) ||
        (bVar4 = hasStyleRule((QStyleSheetStyle *)
                              CONCAT44(in_stack_ffffffffffffeff4,in_stack_ffffffffffffeff0),
                              in_stack_fffffffffffff078,in_stack_fffffffffffff074), bVar4)) ||
       (bVar4 = hasStyleRule((QStyleSheetStyle *)
                             CONCAT44(in_stack_ffffffffffffeff4,in_stack_ffffffffffffeff0),
                             in_stack_fffffffffffff078,in_stack_fffffffffffff074), bVar4)) {
      local_de8 = &DAT_aaaaaaaaaaaaaaaa;
      local_de0 = &DAT_aaaaaaaaaaaaaaaa;
      local_dd8 = &DAT_aaaaaaaaaaaaaaaa;
      QVar21 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8.i),
                          CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0));
      sh.m_data._0_4_ = in_stack_ffffffffffffefc8.i;
      sh.m_size = (qsizetype)in_stack_ffffffffffffefc0;
      sh.m_data._4_4_ = in_stack_ffffffffffffefcc.i;
      QRenderRule::styleHint
                ((QRenderRule *)CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0),sh);
      ::QVariant::toList();
      ::QVariant::~QVariant(&local_28);
      bVar4 = QList<QVariant>::isEmpty((QList<QVariant> *)0x442db0);
      if (bVar4) {
        QByteArrayView::QByteArrayView<4ul>
                  ((QByteArrayView *)in_stack_ffffffffffffefc0,
                   (char (*) [4])CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8.i));
        layout_00.m_size._4_4_ = in_stack_ffffffffffffeff4;
        layout_00.m_size._0_4_ = in_stack_ffffffffffffeff0;
        layout_00.m_data._0_4_ = in_stack_ffffffffffffeff8;
        layout_00.m_data._4_4_ = in_stack_ffffffffffffeffc;
        subControlLayout(layout_00);
        QList<QVariant>::operator=
                  ((QList<QVariant> *)CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0),
                   (QList<QVariant> *)CONCAT44(in_stack_ffffffffffffefac,in_stack_ffffffffffffefa8))
        ;
        QList<QVariant>::~QList((QList<QVariant> *)0x442e09);
      }
      iVar25 = 0;
      memset(local_a28,0xaa,0x88);
      QRenderRule::QRenderRule
                ((QRenderRule *)CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0));
      local_e18[0].i = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
      local_e18[0] = QList<QVariant>::begin
                               ((QList<QVariant> *)
                                CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0));
      local_e20.i = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
      local_e20 = QList<QVariant>::end
                            ((QList<QVariant> *)
                             CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0));
      while( true ) {
        local_e28 = local_e20.i;
        bVar4 = QList<QVariant>::const_iterator::operator!=(local_e18,local_e20);
        if (!bVar4) break;
        pQVar18 = QList<QVariant>::const_iterator::operator*(local_e18);
        iVar8 = ::QVariant::toInt((bool *)pQVar18);
        if ((0x3d < iVar8) && (iVar8 < 0x41)) {
          LVar24 = knownPseudoElements[iVar8].subControl;
          local_e2c.i = (Int)QFlags<QStyle::SubControl>::operator&
                                       ((QFlags<QStyle::SubControl> *)
                                        CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0
                                                ),in_stack_ffffffffffffefac);
          bVar4 = QFlags<QStyle::SubControl>::operator!((QFlags<QStyle::SubControl> *)&local_e2c);
          if (!bVar4) {
            renderRule((QStyleSheetStyle *)
                       CONCAT44(in_stack_fffffffffffff0f4,in_stack_fffffffffffff0f0),
                       (QObject *)QVar21.m_data,(QStyleOption *)QVar21.m_size,iVar25);
            QRenderRule::operator=
                      ((QRenderRule *)CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0),
                       (QRenderRule *)CONCAT44(in_stack_ffffffffffffefac,in_stack_ffffffffffffefa8))
            ;
            QRenderRule::~QRenderRule
                      ((QRenderRule *)CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0))
            ;
            QRenderRule::size((QRenderRule *)
                              CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8.i));
            iVar8 = QSize::width((QSize *)0x442ffa);
            if (local_b4c == LVar24) break;
            iVar25 = iVar8 + iVar25;
          }
        }
        QList<QVariant>::const_iterator::operator++(local_e18);
      }
      QRect::top((QRect *)0x443056);
      QRect::height((QRect *)CONCAT44(in_stack_ffffffffffffefac,in_stack_ffffffffffffefa8));
      QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8.i),
                   in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0,in_stack_ffffffffffffefac,
                   in_stack_ffffffffffffefa8);
      local_b48 = (undefined1  [16])
                  QRenderRule::borderRect
                            ((QRenderRule *)
                             CONCAT44(in_stack_ffffffffffffefcc.i,in_stack_ffffffffffffefc8.i),
                             (QRect *)in_stack_ffffffffffffefc0);
      QRenderRule::~QRenderRule
                ((QRenderRule *)CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0));
      QList<QVariant>::~QList((QList<QVariant> *)0x4430dc);
      auVar2._8_8_ = local_bd4._8_8_;
      auVar2._0_8_ = local_bd4._0_8_;
      auVar1._8_8_ = local_be4._8_8_;
      auVar1._0_8_ = local_be4._0_8_;
      goto LAB_0044326e;
    }
  }
  pQVar9 = baseStyle((QStyleSheetStyle *)
                     CONCAT44(in_stack_ffffffffffffefbc,in_stack_ffffffffffffefb8.i));
  local_b48 = (**(code **)(*(long *)pQVar9 + 0xd8))(pQVar9,in_ESI,in_RDX,local_b4c,in_R8);
  auVar2._8_8_ = local_bd4._8_8_;
  auVar2._0_8_ = local_bd4._0_8_;
  auVar1._8_8_ = local_be4._8_8_;
  auVar1._0_8_ = local_be4._0_8_;
LAB_0044326e:
  local_be4 = auVar1;
  local_bd4 = auVar2;
  QRenderRule::~QRenderRule
            ((QRenderRule *)CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0));
  QStyleSheetStyleRecursionGuard::~QStyleSheetStyleRecursionGuard(&local_b4d);
LAB_00443288:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    QVar20.x1.m_i = local_b48._0_4_;
    auVar26._4_4_ = local_b48._4_4_;
    register0x00000010 = local_b48._8_4_;
    register0x00000014 = local_b48._12_4_;
    return QVar20;
  }
  __stack_chk_fail();
}

Assistant:

QRect QStyleSheetStyle::subControlRect(ComplexControl cc, const QStyleOptionComplex *opt, SubControl sc,
                              const QWidget *w) const
{
    RECURSION_GUARD(return baseStyle()->subControlRect(cc, opt, sc, w))

    QRenderRule rule = renderRule(w, opt);
    switch (cc) {
    case CC_ComboBox:
        if (const QStyleOptionComboBox *cb = qstyleoption_cast<const QStyleOptionComboBox *>(opt)) {
            if (rule.hasBox() || !rule.hasNativeBorder()) {
                switch (sc) {
                case SC_ComboBoxFrame: return rule.borderRect(opt->rect);
                case SC_ComboBoxEditField:
                    {
                        QRenderRule subRule = renderRule(w, opt, PseudoElement_ComboBoxDropDown);
                        QRect r = rule.contentsRect(opt->rect);
                        QRect r2 = positionRect(w, rule, subRule, PseudoElement_ComboBoxDropDown,
                                opt->rect, opt->direction);
                        if (subRule.hasPosition() && subRule.position()->position & Qt::AlignLeft) {
                            return visualRect(opt->direction, r, r.adjusted(r2.width(),0,0,0));
                        } else {
                            return visualRect(opt->direction, r, r.adjusted(0,0,-r2.width(),0));
                        }
                    }
                case SC_ComboBoxArrow: {
                    QRenderRule subRule = renderRule(w, opt, PseudoElement_ComboBoxDropDown);
                    return positionRect(w, rule, subRule, PseudoElement_ComboBoxDropDown, opt->rect, opt->direction);
                                                                           }
                case SC_ComboBoxListBoxPopup:
                default:
                    return baseStyle()->subControlRect(cc, opt, sc, w);
                }
            }

            QStyleOptionComboBox comboBox(*cb);
            comboBox.rect = rule.borderRect(opt->rect);
            return rule.baseStyleCanDraw() ? baseStyle()->subControlRect(cc, &comboBox, sc, w)
                                           : QWindowsStyle::subControlRect(cc, &comboBox, sc, w);
        }
        break;

#if QT_CONFIG(spinbox)
    case CC_SpinBox:
        if (const QStyleOptionSpinBox *spin = qstyleoption_cast<const QStyleOptionSpinBox *>(opt)) {
            QRenderRule upRule = renderRule(w, opt, PseudoElement_SpinBoxUpButton);
            QRenderRule downRule = renderRule(w, opt, PseudoElement_SpinBoxDownButton);
            bool ruleMatch = rule.hasBox() || !rule.hasNativeBorder();
            bool upRuleMatch = upRule.hasGeometry() || upRule.hasPosition();
            bool downRuleMatch = downRule.hasGeometry() || downRule.hasPosition();
            if (ruleMatch || upRuleMatch || downRuleMatch) {
                switch (sc) {
                case SC_SpinBoxFrame:
                    return rule.borderRect(opt->rect);
                case SC_SpinBoxEditField:
                    {
                        QRect r = rule.contentsRect(opt->rect);
                        // Use the widest button on each side to determine edit field size.
                        Qt::Alignment upAlign, downAlign;

                        upAlign = upRule.hasPosition() ? upRule.position()->position
                                : Qt::Alignment(Qt::AlignRight);
                        upAlign = resolveAlignment(opt->direction, upAlign);

                        downAlign = downRule.hasPosition() ? downRule.position()->position
                                : Qt::Alignment(Qt::AlignRight);
                        downAlign = resolveAlignment(opt->direction, downAlign);

                        const bool hasButtons = (spin->buttonSymbols != QAbstractSpinBox::NoButtons);
                        const int upSize = hasButtons
                                ? subControlRect(CC_SpinBox, opt, SC_SpinBoxUp, w).width() : 0;
                        const int downSize = hasButtons
                                ? subControlRect(CC_SpinBox, opt, SC_SpinBoxDown, w).width() : 0;

                        int widestL = qMax((upAlign & Qt::AlignLeft) ? upSize : 0,
                                (downAlign & Qt::AlignLeft) ? downSize : 0);
                        int widestR = qMax((upAlign & Qt::AlignRight) ? upSize : 0,
                                (downAlign & Qt::AlignRight) ? downSize : 0);
                        r.setRight(r.right() - widestR);
                        r.setLeft(r.left() + widestL);
                        return r;
                    }
                case SC_SpinBoxDown:
                    if (downRuleMatch)
                        return positionRect(w, rule, downRule, PseudoElement_SpinBoxDownButton,
                                opt->rect, opt->direction);
                    break;
                case SC_SpinBoxUp:
                    if (upRuleMatch)
                        return positionRect(w, rule, upRule, PseudoElement_SpinBoxUpButton,
                                opt->rect, opt->direction);
                    break;
                default:
                    break;
                }

                return baseStyle()->subControlRect(cc, opt, sc, w);
            }

            QStyleOptionSpinBox spinBox(*spin);
            spinBox.rect = rule.borderRect(opt->rect);
            return rule.baseStyleCanDraw() ? baseStyle()->subControlRect(cc, &spinBox, sc, w)
                                           : QWindowsStyle::subControlRect(cc, &spinBox, sc, w);
        }
        break;
#endif // QT_CONFIG(spinbox)

    case CC_GroupBox:
        if (const QStyleOptionGroupBox *gb = qstyleoption_cast<const QStyleOptionGroupBox *>(opt)) {
            switch (sc) {
            case SC_GroupBoxFrame:
            case SC_GroupBoxContents: {
                if (rule.hasBox() || !rule.hasNativeBorder()) {
                    return sc == SC_GroupBoxFrame ? rule.borderRect(opt->rect)
                                                  : rule.contentsRect(opt->rect);
                }
                QStyleOptionGroupBox groupBox(*gb);
                groupBox.rect = rule.borderRect(opt->rect);
                return baseStyle()->subControlRect(cc, &groupBox, sc, w);
            }
            default:
            case SC_GroupBoxLabel:
            case SC_GroupBoxCheckBox: {
                QRenderRule indRule = renderRule(w, opt, PseudoElement_GroupBoxIndicator);
                QRenderRule labelRule = renderRule(w, opt, PseudoElement_GroupBoxTitle);
                if (!labelRule.hasPosition() && !labelRule.hasGeometry() && !labelRule.hasBox()
                    && !labelRule.hasBorder() && !indRule.hasContentsSize()) {
                    QStyleOptionGroupBox groupBox(*gb);
                    groupBox.rect = rule.borderRect(opt->rect);
                    return baseStyle()->subControlRect(cc, &groupBox, sc, w);
                }
                int tw = opt->fontMetrics.horizontalAdvance(gb->text);
                int th = opt->fontMetrics.height();
                int spacing = pixelMetric(QStyle::PM_CheckBoxLabelSpacing, opt, w);
                int iw = pixelMetric(QStyle::PM_IndicatorWidth, opt, w);
                int ih = pixelMetric(QStyle::PM_IndicatorHeight, opt, w);

                if (gb->subControls & QStyle::SC_GroupBoxCheckBox) {
                    tw = tw + iw + spacing;
                    th = qMax(th, ih);
                }
                if (!labelRule.hasGeometry()) {
                    labelRule.geo = new QStyleSheetGeometryData(tw, th, tw, th, -1, -1);
                } else {
                    labelRule.geo->width = tw;
                    labelRule.geo->height = th;
                }
                if (!labelRule.hasPosition()) {
                    labelRule.p = new QStyleSheetPositionData(0, 0, 0, 0, defaultOrigin(PseudoElement_GroupBoxTitle),
                                                              gb->textAlignment, PositionMode_Static);
                }
                QRect r = positionRect(w, rule, labelRule, PseudoElement_GroupBoxTitle,
                                      opt->rect, opt->direction);
                if (gb->subControls & SC_GroupBoxCheckBox) {
                    r = labelRule.contentsRect(r);
                    if (sc == SC_GroupBoxLabel) {
                        r.setLeft(r.left() + iw + spacing);
                        r.setTop(r.center().y() - th/2);
                    } else {
                        r = QRect(r.left(), r.center().y() - ih/2, iw, ih);
                    }
                    return r;
                } else {
                    return labelRule.contentsRect(r);
                }
            }
            } // switch
        }
        break;

    case CC_ToolButton:
        if (const QStyleOptionToolButton *tb = qstyleoption_cast<const QStyleOptionToolButton *>(opt)) {
            if (rule.hasBox() || !rule.hasNativeBorder()) {
                switch (sc) {
                case SC_ToolButton: return rule.borderRect(opt->rect);
                case SC_ToolButtonMenu: {
                    QRenderRule subRule = renderRule(w, opt, PseudoElement_ToolButtonMenu);
                    return positionRect(w, rule, subRule, PseudoElement_ToolButtonMenu, opt->rect, opt->direction);
                                                                            }
                default:
                    break;
                }
            }

            QStyleOptionToolButton tool(*tb);
            tool.rect = rule.borderRect(opt->rect);
            return rule.baseStyleCanDraw() ? baseStyle()->subControlRect(cc, &tool, sc, w)
                                           : QWindowsStyle::subControlRect(cc, &tool, sc, w);
            }
            break;

#if QT_CONFIG(scrollbar)
    case CC_ScrollBar:
        if (const QStyleOptionSlider *sb = qstyleoption_cast<const QStyleOptionSlider *>(opt)) {
            QStyleOptionSlider styleOptionSlider(*sb);
            styleOptionSlider.rect = rule.borderRect(opt->rect);
            if (rule.hasDrawable() || rule.hasBox()) {
                QRect grooveRect;
                if (!rule.hasBox()) {
                    grooveRect = rule.baseStyleCanDraw() ? baseStyle()->subControlRect(cc, sb, SC_ScrollBarGroove, w)
                                 : QWindowsStyle::subControlRect(cc, sb, SC_ScrollBarGroove, w);
                } else {
                    grooveRect = rule.contentsRect(opt->rect);
                }

                PseudoElement pe = PseudoElement_None;

                switch (sc) {
                case SC_ScrollBarGroove:
                    return grooveRect;
                case SC_ScrollBarAddPage:
                case SC_ScrollBarSubPage:
                case SC_ScrollBarSlider: {
                    QRect contentRect = grooveRect;
                    if (hasStyleRule(w, PseudoElement_ScrollBarSlider)) {
                        QRenderRule sliderRule = renderRule(w, opt, PseudoElement_ScrollBarSlider);
                        Origin origin = sliderRule.hasPosition() ? sliderRule.position()->origin : defaultOrigin(PseudoElement_ScrollBarSlider);
                        contentRect = rule.originRect(opt->rect, origin);
                    }
                    int maxlen = (styleOptionSlider.orientation == Qt::Horizontal) ? contentRect.width() : contentRect.height();
                    int sliderlen;
                    if (sb->maximum != sb->minimum) {
                        uint range = sb->maximum - sb->minimum;
                        sliderlen = (qint64(sb->pageStep) * maxlen) / (range + sb->pageStep);

                        int slidermin = pixelMetric(PM_ScrollBarSliderMin, sb, w);
                        if (sliderlen < slidermin || range > INT_MAX / 2)
                            sliderlen = slidermin;
                        if (sliderlen > maxlen)
                            sliderlen = maxlen;
                    } else {
                        sliderlen = maxlen;
                    }
                    int sliderstart = (styleOptionSlider.orientation == Qt::Horizontal ? contentRect.left() : contentRect.top())
                        + sliderPositionFromValue(sb->minimum, sb->maximum, sb->sliderPosition,
                                                  maxlen - sliderlen, sb->upsideDown);

                    QRect sr = (sb->orientation == Qt::Horizontal)
                               ? QRect(sliderstart, contentRect.top(), sliderlen, contentRect.height())
                               : QRect(contentRect.left(), sliderstart, contentRect.width(), sliderlen);
                    if (sc == SC_ScrollBarSubPage)
                        sr = QRect(contentRect.topLeft(), sb->orientation == Qt::Horizontal ? sr.bottomLeft() : sr.topRight());
                    else if (sc == SC_ScrollBarAddPage)
                        sr = QRect(sb->orientation == Qt::Horizontal ? sr.topRight() : sr.bottomLeft(), contentRect.bottomRight());
                    return visualRect(styleOptionSlider.direction, grooveRect, sr);
                }
                case SC_ScrollBarAddLine: pe = PseudoElement_ScrollBarAddLine; break;
                case SC_ScrollBarSubLine: pe = PseudoElement_ScrollBarSubLine; break;
                case SC_ScrollBarFirst: pe = PseudoElement_ScrollBarFirst;  break;
                case SC_ScrollBarLast: pe = PseudoElement_ScrollBarLast; break;
                default: break;
                }
                if (hasStyleRule(w,pe)) {
                    QRenderRule subRule = renderRule(w, opt, pe);
                    if (subRule.hasPosition() || subRule.hasGeometry() || subRule.hasBox()) {
                        const QStyleSheetPositionData *pos = subRule.position();
                        QRect originRect = grooveRect;
                        if (rule.hasBox()) {
                            Origin origin = (pos && pos->origin != Origin_Unknown) ? pos->origin : defaultOrigin(pe);
                            originRect = rule.originRect(opt->rect, origin);
                        }
                        return positionRect(w, subRule, pe, originRect, styleOptionSlider.direction);
                    }
                }
            }
            return rule.baseStyleCanDraw() ? baseStyle()->subControlRect(cc, &styleOptionSlider, sc, w)
                                           : QWindowsStyle::subControlRect(cc, &styleOptionSlider, sc, w);
        }
        break;
#endif // QT_CONFIG(scrollbar)

#if QT_CONFIG(slider)
    case CC_Slider:
        if (const QStyleOptionSlider *slider = qstyleoption_cast<const QStyleOptionSlider *>(opt)) {
            QRenderRule subRule = renderRule(w, opt, PseudoElement_SliderGroove);
            if (!subRule.hasDrawable())
                break;
            subRule.img = nullptr;
            QRect gr = positionRect(w, rule, subRule, PseudoElement_SliderGroove, opt->rect, opt->direction);
            switch (sc) {
            case SC_SliderGroove:
                return gr;
            case SC_SliderHandle: {
                bool horizontal = slider->orientation & Qt::Horizontal;
                QRect cr = subRule.contentsRect(gr);
                QRenderRule subRule2 = renderRule(w, opt, PseudoElement_SliderHandle);
                int len = horizontal ? subRule2.size().width() : subRule2.size().height();
                subRule2.img = nullptr;
                subRule2.geo = nullptr;
                cr = positionRect(w, subRule2, PseudoElement_SliderHandle, cr, opt->direction);
                int thickness = horizontal ? cr.height() : cr.width();
                int sliderPos = sliderPositionFromValue(slider->minimum, slider->maximum, slider->sliderPosition,
                                                        (horizontal ? cr.width() : cr.height()) - len, slider->upsideDown);
                cr = horizontal ? QRect(cr.x() + sliderPos, cr.y(), len, thickness)
                                  : QRect(cr.x(), cr.y() + sliderPos, thickness, len);
                return subRule2.borderRect(cr);
                break; }
            case SC_SliderTickmarks:
                // TODO...
            default:
                break;
            }
        }
        break;
#endif // QT_CONFIG(slider)

    case CC_MdiControls:
        if (hasStyleRule(w, PseudoElement_MdiCloseButton)
            || hasStyleRule(w, PseudoElement_MdiNormalButton)
            || hasStyleRule(w, PseudoElement_MdiMinButton)) {
            QList<QVariant> layout = rule.styleHint("button-layout"_L1).toList();
            if (layout.isEmpty())
                layout = subControlLayout("mNX");

            int x = 0, width = 0;
            QRenderRule subRule;
            for (const QVariant &val : std::as_const(layout)) {
                int layoutButton = val.toInt();
                if (layoutButton < PseudoElement_MdiCloseButton
                    || layoutButton > PseudoElement_MdiNormalButton)
                    continue;
                QStyle::SubControl control = knownPseudoElements[layoutButton].subControl;
                if (!(opt->subControls & control))
                    continue;
                subRule = renderRule(w, opt, layoutButton);
                width = subRule.size().width();
                if (sc == control)
                    break;
                x += width;
            }

            return subRule.borderRect(QRect(x, opt->rect.top(), width, opt->rect.height()));
        }
        break;

    case CC_TitleBar:
        if (const QStyleOptionTitleBar *tb = qstyleoption_cast<const QStyleOptionTitleBar *>(opt)) {
            QRenderRule subRule = renderRule(w, opt, PseudoElement_TitleBar);
            if (!subRule.hasDrawable() && !subRule.hasBox() && !subRule.hasBorder())
                break;
            QHash<QStyle::SubControl, QRect> layoutRects = titleBarLayout(w, tb);
            return layoutRects.value(sc);
        }
        break;

    default:
        break;
    }

    return baseStyle()->subControlRect(cc, opt, sc, w);
}